

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O3

decNumber * decNaNs(decNumber *res,decNumber *lhs,decNumber *rhs,decContext *set,uint32_t *status)

{
  byte bVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  
  if ((lhs->bits & 0x10) == 0) {
    if (rhs != (decNumber *)0x0) {
      if ((rhs->bits & 0x10) == 0) {
        if ((lhs->bits & 0x20) == 0) {
          lhs = rhs;
        }
      }
      else {
        *status = *status | 0x40000080;
        lhs = rhs;
      }
    }
  }
  else {
    *status = *status | 0x40000080;
  }
  uVar3 = set->digits;
  uVar4 = (ulong)uVar3;
  if (lhs->digits <= (int)uVar3) {
    uprv_decNumberCopy_63(res,lhs);
    goto LAB_00247597;
  }
  res->bits = lhs->bits;
  if ((int)uVar3 < 0x32) {
    if (uVar3 != 0) {
      uVar4 = (ulong)""[(int)uVar3];
      goto LAB_0024754a;
    }
  }
  else {
LAB_0024754a:
    lVar5 = 9;
    do {
      lVar2 = lVar5 + -9;
      res->lsu[lVar2] = lhs->lsu[lVar5 + -9];
      lVar5 = lVar5 + 1;
    } while (res->lsu + lVar2 + 1 < res->lsu + uVar4);
    uVar3 = set->digits;
    if (0x31 < (int)uVar3) {
      res->digits = uVar3;
      goto LAB_00247597;
    }
  }
  bVar1 = ""[(int)uVar3];
  res->digits = (uint)bVar1;
  if (bVar1 - uVar3 != 0 && (int)uVar3 <= (int)(uint)bVar1) {
    decDecap(res,bVar1 - uVar3);
  }
LAB_00247597:
  res->bits = res->bits & 0xcf | 0x20;
  res->exponent = 0;
  return res;
}

Assistant:

static decNumber * decNaNs(decNumber *res, const decNumber *lhs,
                           const decNumber *rhs, decContext *set,
                           uInt *status) {
  /* This decision tree ends up with LHS being the source pointer,  */
  /* and status updated if need be  */
  if (lhs->bits & DECSNAN)
    *status|=DEC_Invalid_operation | DEC_sNaN;
   else if (rhs==NULL);
   else if (rhs->bits & DECSNAN) {
    lhs=rhs;
    *status|=DEC_Invalid_operation | DEC_sNaN;
    }
   else if (lhs->bits & DECNAN);
   else lhs=rhs;

  /* propagate the payload  */
  if (lhs->digits<=set->digits) uprv_decNumberCopy(res, lhs); /* easy  */
   else { /* too long  */
    const Unit *ul;
    Unit *ur, *uresp1;
    /* copy safe number of units, then decapitate  */
    res->bits=lhs->bits;                /* need sign etc.  */
    uresp1=res->lsu+D2U(set->digits);
    for (ur=res->lsu, ul=lhs->lsu; ur<uresp1; ur++, ul++) *ur=*ul;
    res->digits=D2U(set->digits)*DECDPUN;
    /* maybe still too long  */
    if (res->digits>set->digits) decDecap(res, res->digits-set->digits);
    }

  res->bits&=~DECSNAN;        /* convert any sNaN to NaN, while  */
  res->bits|=DECNAN;          /* .. preserving sign  */
  res->exponent=0;            /* clean exponent  */
                              /* [coefficient was copied/decapitated]  */
  return res;
  }